

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>
::ReadNumArgs(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>
              *this,int min_args)

{
  int iVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (min_args <= iVar1) {
    return iVar1;
  }
  local_38 = 0;
  uStack_30 = 0;
  local_20.types_ = 0;
  local_20.field_1.values_ = (Value *)&local_38;
  BinaryReaderBase::ReportError
            (&this->reader_->super_BinaryReaderBase,(CStringRef)0x26079e,&local_20);
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }